

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  undefined8 uVar2;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  undefined8 unaff_RBX;
  int iVar3;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_58;
  code *pcStack_50;
  long lStack_48;
  long lStack_40;
  code *pcStack_38;
  undefined8 uStack_28;
  code *pcStack_20;
  long local_18;
  long local_10;
  
  iVar3 = (int)&local_18;
  pcStack_20 = (code *)0x19d699;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    pcStack_20 = (code *)0x19d6bc;
    uVar2 = uv_default_loop();
    in_RCX = &addr4;
    pcStack_20 = (code *)0x19d6dc;
    iVar1 = uv_getnameinfo(uVar2,&req,getnameinfo_req,&addr4,0);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) goto LAB_0019d769;
    pcStack_20 = (code *)0x19d6fb;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x19d705;
    uv_run(uVar2,0);
    pcStack_20 = (code *)0x19d70a;
    unaff_RBX = uv_default_loop();
    pcStack_20 = (code *)0x19d71e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_20 = (code *)0x19d728;
    uv_run(unaff_RBX,0);
    local_10 = 0;
    pcStack_20 = (code *)0x19d736;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x19d73e;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (long)iVar1;
    if (local_10 == local_18) {
      pcStack_20 = (code *)0x19d754;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x19d769;
    run_test_getnameinfo_basic_ip4_cold_1();
LAB_0019d769:
    pcStack_20 = (code *)0x19d776;
    run_test_getnameinfo_basic_ip4_cold_2();
  }
  plVar4 = &local_10;
  pcStack_20 = getnameinfo_req;
  run_test_getnameinfo_basic_ip4_cold_3();
  if (plVar4 == (long *)0x0) {
    pcStack_38 = (code *)0x19d7bd;
    getnameinfo_req_cold_4();
LAB_0019d7bd:
    pcStack_38 = (code *)0x19d7cc;
    getnameinfo_req_cold_1();
LAB_0019d7cc:
    pcStack_38 = (code *)0x19d7d1;
    getnameinfo_req_cold_3();
  }
  else {
    pcStack_20 = (code *)(long)iVar3;
    uStack_28 = 0;
    if (pcStack_20 != (code *)0x0) goto LAB_0019d7bd;
    if (extraout_RDX == 0) goto LAB_0019d7cc;
    if (in_RCX != (sockaddr_in *)0x0) {
      return iVar3;
    }
  }
  pcStack_38 = run_test_getnameinfo_basic_ip4_sync;
  getnameinfo_req_cold_2();
  pcStack_50 = (code *)0x19d7f3;
  pcStack_38 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  lStack_40 = (long)iVar1;
  lStack_48 = 0;
  if (lStack_40 == 0) {
    pcStack_50 = (code *)0x19d816;
    uVar2 = uv_default_loop();
    pcStack_50 = (code *)0x19d831;
    iVar1 = uv_getnameinfo(uVar2,&req,0,&addr4,0);
    lStack_40 = (long)iVar1;
    lStack_48 = 0;
    if (lStack_40 != 0) goto LAB_0019d8f7;
    lStack_40 = (long)req.host[0];
    lStack_48 = 0;
    if (lStack_40 == 0) goto LAB_0019d904;
    lStack_40 = (long)req.service[0];
    lStack_48 = 0;
    if (lStack_40 == 0) goto LAB_0019d911;
    pcStack_50 = (code *)0x19d898;
    unaff_RBX = uv_default_loop();
    pcStack_50 = (code *)0x19d8ac;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_50 = (code *)0x19d8b6;
    uv_run(unaff_RBX,0);
    lStack_40 = 0;
    pcStack_50 = (code *)0x19d8c4;
    uVar2 = uv_default_loop();
    pcStack_50 = (code *)0x19d8cc;
    iVar1 = uv_loop_close(uVar2);
    lStack_48 = (long)iVar1;
    if (lStack_40 == lStack_48) {
      pcStack_50 = (code *)0x19d8e2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_50 = (code *)0x19d8f7;
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0019d8f7:
    pcStack_50 = (code *)0x19d904;
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0019d904:
    pcStack_50 = (code *)0x19d911;
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0019d911:
    pcStack_50 = (code *)0x19d91e;
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  pcStack_50 = run_test_getnameinfo_basic_ip6;
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  pcStack_50 = (code *)unaff_RBX;
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  lStack_58 = (long)iVar1;
  if (lStack_58 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(uVar2,&req,getnameinfo_req,&addr6,0);
    lStack_58 = (long)iVar1;
    if (lStack_58 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_58 = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (lStack_58 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019da25;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0019da25:
  plVar4 = &lStack_58;
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT_OK(r);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}